

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateDefaultOptionalValues(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  DefaultOptionalValueCase DVar2;
  TypeCase TVar3;
  int32 iVar4;
  ModelDescription *this;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  FeatureType *pFVar5;
  ArrayFeatureType *this_01;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  reference local_40;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  ModelDescription *description;
  Model *format_local;
  
  this = Specification::Model::description(format);
  this_00 = Specification::ModelDescription::input(this);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (this_00);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    (this_00);
  do {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end1,(iterator *)&input);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_40 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end1);
    pFVar5 = Specification::FeatureDescription::type(local_40);
    bVar1 = Specification::FeatureType::isoptional(pFVar5);
    if (bVar1) {
      pFVar5 = Specification::FeatureDescription::type(local_40);
      this_01 = Specification::FeatureType::multiarraytype(pFVar5);
      DVar2 = Specification::ArrayFeatureType::defaultOptionalValue_case(this_01);
      if (((DVar2 == kIntDefaultValue) || (DVar2 == kFloatDefaultValue)) ||
         (DVar2 == kDoubleDefaultValue)) {
        TVar3 = Specification::Model::Type_case(format);
        if (((TVar3 != kNeuralNetwork) &&
            (TVar3 = Specification::Model::Type_case(format), TVar3 != kNeuralNetworkRegressor)) &&
           (TVar3 = Specification::Model::Type_case(format), TVar3 != kNeuralNetworkClassifier)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_60,
                     "Default optional values are only allowed for neural networks.",&local_61);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          std::allocator<char>::~allocator((allocator<char> *)&local_61);
          return __return_storage_ptr__;
        }
        iVar4 = Specification::Model::specificationversion(format);
        if (iVar4 < 5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_98,
                     "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!"
                     ,&local_99);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
          return __return_storage_ptr__;
        }
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline Result validateDefaultOptionalValues(const Specification::Model& format) {
        // - Validate default optional values for NN Model that
        //   - Has default value set if input is optional and spec 5 model
        // - Error out if model is not Neural Network
        const Specification::ModelDescription& description = format.description();

        for (const auto& input : description.input()) {
            if (input.type().isoptional()) {
                switch (input.type().multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        // Default value for optional inputs is applicable
                        // only for NeuralNetwork models with Spec 5 (iOS 14) onwards.
                        if (format.Type_case() != Specification::Model::kNeuralNetwork &&
                            format.Type_case() != Specification::Model::kNeuralNetworkRegressor &&
                            format.Type_case() != Specification::Model::kNeuralNetworkClassifier) {
                            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                          "Default optional values are only allowed for neural networks.");
                        }
                        if (format.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS14) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!");
                        }
                        break;
                    default:
                        break;
                }
            }
        }
        return Result();
    }